

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O3

cf_hashtbl_iter_t cf_hashtbl_iter_init(cf_hashtbl_t *self)

{
  bool bVar1;
  cf_hashtbl_iter_t phVar2;
  uint uVar3;
  
  uVar3 = 1;
  do {
    phVar2 = self->table[uVar3 - 1];
    if (self->table[uVar3 - 1] != (cf_hashtbl_iter_t)0x0) {
      return phVar2;
    }
    bVar1 = uVar3 <= self->hashmsk;
    uVar3 = uVar3 + 1;
  } while (bVar1);
  return phVar2;
}

Assistant:

cf_hashtbl_iter_t cf_hashtbl_iter_init(cf_hashtbl_t* self) {
    cf_uint32_t i;
    /* find the first table index */
    for (i = 0; i <= self->hashmsk; i++) {
        if (self->table[i]) {
            return self->table[i];
        }
    }
    return CF_NULL_PTR;
}